

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O0

void __thiscall
TestRegenerateCmakeAddTarget_Interface::Run(TestRegenerateCmakeAddTarget_Interface *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  byte bVar1;
  runtime_error *this_00;
  __type v;
  ostringstream oss;
  string expectedOutput;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  bool isHeaderOnly;
  Configuration config;
  Component comp;
  Component *in_stack_fffffffffffff880;
  undefined1 in_stack_fffffffffffff897;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff898;
  Component *in_stack_fffffffffffff8a0;
  Configuration *in_stack_fffffffffffff8a8;
  undefined7 in_stack_fffffffffffff8b0;
  undefined1 in_stack_fffffffffffff8b7;
  iterator in_stack_fffffffffffff8b8;
  allocator *paVar2;
  size_type in_stack_fffffffffffff8c0;
  string *local_730;
  path *in_stack_fffffffffffff8f8;
  Component *in_stack_fffffffffffff900;
  string *this_01;
  string local_6e8 [39];
  byte local_6c1;
  ostringstream local_6c0 [176];
  Configuration *in_stack_fffffffffffff9f0;
  allocator local_541;
  string local_540 [36];
  undefined1 local_51c;
  allocator local_51b;
  allocator local_51a;
  allocator local_519;
  string *local_518;
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string *local_4b0;
  undefined8 local_4a8;
  undefined1 local_481;
  string local_80 [48];
  string local_50 [80];
  
  boost::filesystem::path::path
            ((path *)CONCAT17(in_stack_fffffffffffff8b7,in_stack_fffffffffffff8b0),
             (value_type *)in_stack_fffffffffffff8a8);
  Component::Component(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  boost::filesystem::path::~path((path *)0x15788f);
  std::__cxx11::string::operator=(local_80,"add_library");
  std::__cxx11::string::operator=(local_50,"  EXCLUDE_FROM_ALL\n");
  Configuration::Configuration(in_stack_fffffffffffff9f0);
  local_481 = 1;
  local_51c = 1;
  this_01 = local_510;
  local_518 = this_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this_01,"Analysis.cpp",&local_519);
  paVar2 = &local_51a;
  local_518 = local_4f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"Analysis.h",paVar2);
  local_518 = local_4d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"main.cpp",&local_51b);
  local_51c = 0;
  local_4b0 = local_510;
  local_4a8 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1579df);
  __l._M_len = in_stack_fffffffffffff8c0;
  __l._M_array = in_stack_fffffffffffff8b8;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)CONCAT17(in_stack_fffffffffffff8b7,in_stack_fffffffffffff8b0),__l,
         (allocator_type *)in_stack_fffffffffffff8a8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x157a10);
  local_730 = (string *)&local_4b0;
  do {
    local_730 = local_730 + -0x20;
    std::__cxx11::string::~string(local_730);
  } while (local_730 != local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_51b);
  std::allocator<char>::~allocator((allocator<char> *)&local_51a);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  paVar2 = &local_541;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_540,"add_library(${PROJECT_NAME} INTERFACE\n  EXCLUDE_FROM_ALL\n)\n\n",paVar2);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::__cxx11::ostringstream::ostringstream(local_6c0);
  RegenerateCmakeAddTarget
            ((ostream *)CONCAT17(in_stack_fffffffffffff8b7,in_stack_fffffffffffff8b0),
             in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff898,(bool)in_stack_fffffffffffff897);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  std::__cxx11::string::~string(local_6e8);
  local_6c1 = bVar1 & 1;
  if (local_6c1 == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_6c0);
  std::__cxx11::string::~string(local_540);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x157d90);
  Configuration::~Configuration((Configuration *)in_stack_fffffffffffff880);
  Component::~Component(in_stack_fffffffffffff880);
  return;
}

Assistant:

TEST(RegenerateCmakeAddTarget_Interface) {
  Component comp("./MyComponent/");
  comp.type = "add_library";
  comp.additionalTargetParameters = "  EXCLUDE_FROM_ALL\n";

  Configuration config;

  bool isHeaderOnly = true;

  const std::list<std::string> files{
    "Analysis.cpp",
    "Analysis.h",
    "main.cpp"
  };

  const std::string expectedOutput(
      "add_library(${PROJECT_NAME} INTERFACE\n"
      "  EXCLUDE_FROM_ALL\n"
      ")\n"
      "\n");

  std::ostringstream oss;
  RegenerateCmakeAddTarget(oss, config, comp, files, isHeaderOnly);

  ASSERT(oss.str() == expectedOutput);
}